

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O2

bool __thiscall
cmVariableWatch::VariableAccessed
          (cmVariableWatch *this,string *variable,int access_type,char *newValue,cmMakefile *mf)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
                  *)this,variable);
  p_Var2 = &(this->WatchMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node != p_Var2) {
    for (p_Var3 = *(_Base_ptr *)(cVar1._M_node + 2); p_Var3 != cVar1._M_node[2]._M_parent;
        p_Var3 = (_Base_ptr)&p_Var3->_M_parent) {
      (*(code *)**(undefined8 **)p_Var3)
                (variable,access_type,(*(undefined8 **)p_Var3)[1],newValue,mf);
    }
  }
  return (_Rb_tree_header *)cVar1._M_node != p_Var2;
}

Assistant:

bool  cmVariableWatch::VariableAccessed(const std::string& variable,
                                        int access_type,
                                        const char* newValue,
                                        const cmMakefile* mf) const
{
  cmVariableWatch::StringToVectorOfPairs::const_iterator mit =
    this->WatchMap.find(variable);
  if ( mit  != this->WatchMap.end() )
    {
    const cmVariableWatch::VectorOfPairs* vp = &mit->second;
    cmVariableWatch::VectorOfPairs::const_iterator it;
    for ( it = vp->begin(); it != vp->end(); it ++ )
      {
      (*it)->Method(variable, access_type, (*it)->ClientData,
        newValue, mf);
      }
    return true;
    }
  return false;
}